

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Square.cpp
# Opt level: O2

Square * __thiscall Square::setLeft(Square *this,Square *sq)

{
  mapped_type *ppSVar1;
  undefined8 uVar2;
  allocator local_39;
  key_type local_38;
  
  (this->adjacents).super__Vector_base<Square_*,_std::allocator<Square_*>_>._M_impl.
  super__Vector_impl_data._M_start[3] = sq;
  std::__cxx11::string::string((string *)&local_38,"left",&local_39);
  ppSVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Square_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Square_*>_>_>
            ::operator[](&this->adjacentMap,&local_38);
  *ppSVar1 = sq;
  uVar2 = std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  _Unwind_Resume(uVar2);
}

Assistant:

Square *Square::setLeft(Square *sq) {
    this->adjacents[3] = sq;
    this->adjacentMap["left"] = sq;
}